

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

void __thiscall QJpegHandlerPrivate::~QJpegHandlerPrivate(QJpegHandlerPrivate *this)

{
  if (this->iod_src != (my_jpeg_source_mgr *)0x0) {
    jpeg_destroy_decompress(&this->info);
    operator_delete(this->iod_src,0x1048);
    this->iod_src = (my_jpeg_source_mgr *)0x0;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->iccProfile).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->readTexts).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->description).d);
  QVariant::~QVariant(&this->size);
  return;
}

Assistant:

~QJpegHandlerPrivate()
    {
        if (iod_src)
        {
            jpeg_destroy_decompress(&info);
            delete iod_src;
            iod_src = nullptr;
        }
    }